

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.h
# Opt level: O2

void __thiscall
embree::avx512::CurveGeometryInterface<embree::CatmullRomCurveT>::interpolate_impl<4>
          (CurveGeometryInterface<embree::CatmullRomCurveT> *this,RTCInterpolateArguments *args)

{
  int *piVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  char *pcVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  vector<BufferView<Vec3ff>_> *pvVar20;
  ulong uVar21;
  ulong uVar22;
  uint i;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined4 uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  uVar4 = args->primID;
  fVar3 = args->u;
  pfVar6 = args->P;
  pfVar7 = args->dPdu;
  pfVar8 = args->ddPdudu;
  uVar5 = args->valueCount;
  pvVar20 = &(this->super_CurveGeometry).vertices;
  if (args->bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    pvVar20 = (vector<BufferView<Vec3ff>_> *)&(this->super_CurveGeometry).vertexAttribs;
  }
  pcVar9 = pvVar20->items[args->bufferSlot].super_RawBufferView.ptr_ofs;
  uVar22 = (ulong)(uint)pvVar20->items[args->bufferSlot].super_RawBufferView.stride;
  auVar26 = vpbroadcastd_avx512vl();
  fVar18 = 1.0 - fVar3;
  auVar32 = SUB6416(ZEXT464(0x40400000),0);
  auVar38 = ZEXT416((uint)fVar3);
  auVar29 = SUB6416(ZEXT464(0xc0a00000),0);
  auVar19 = vfmadd213ss_fma(auVar32,auVar38,auVar29);
  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * 3.0 * fVar3)),auVar19,
                            ZEXT416((uint)(fVar3 + fVar3)));
  auVar33 = SUB6416(ZEXT464(0x40000000),0);
  auVar19 = vfmadd213ss_fma(auVar19,ZEXT416((uint)(fVar3 * fVar3)),auVar33);
  auVar39 = ZEXT416((uint)fVar18);
  auVar28 = vfmadd213ss_fma(auVar32,auVar39,auVar29);
  auVar28 = vfmadd213ss_fma(auVar28,ZEXT416((uint)(fVar18 * fVar18)),auVar33);
  fVar14 = fVar18 * fVar18 * -fVar3 * 0.5;
  fVar15 = auVar19._0_4_ * 0.5;
  fVar16 = auVar28._0_4_ * 0.5;
  fVar17 = fVar3 * fVar3 * -fVar18 * 0.5;
  auVar34._4_4_ = fVar14;
  auVar34._0_4_ = fVar14;
  auVar34._8_4_ = fVar14;
  auVar34._12_4_ = fVar14;
  auVar35._4_4_ = fVar15;
  auVar35._0_4_ = fVar15;
  auVar35._8_4_ = fVar15;
  auVar35._12_4_ = fVar15;
  auVar36._4_4_ = fVar16;
  auVar36._0_4_ = fVar16;
  auVar36._8_4_ = fVar16;
  auVar36._12_4_ = fVar16;
  auVar37._4_4_ = fVar17;
  auVar37._0_4_ = fVar17;
  auVar37._8_4_ = fVar17;
  auVar37._12_4_ = fVar17;
  auVar28 = vfnmadd231ss_fma(ZEXT416((uint)((fVar18 + fVar18) * fVar3)),auVar39,auVar39);
  auVar19 = vfmadd213ss_fma(auVar32,auVar38,auVar33);
  auVar27 = vmulss_avx512f(auVar39,ZEXT416(0xc0400000));
  auVar27 = vmulss_avx512f(auVar39,auVar27);
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)(fVar18 + fVar18)),auVar19);
  auVar19 = vfmadd213ss_fma(ZEXT416((uint)(fVar18 * -2.0)),auVar38,ZEXT416((uint)(fVar3 * fVar3)));
  fVar3 = auVar28._0_4_ * 0.5;
  fVar14 = auVar44._0_4_ * 0.5;
  auVar28 = vmulss_avx512f(auVar27,SUB6416(ZEXT464(0x3f000000),0));
  fVar15 = auVar19._0_4_ * 0.5;
  auVar39._4_4_ = fVar3;
  auVar39._0_4_ = fVar3;
  auVar39._8_4_ = fVar3;
  auVar39._12_4_ = fVar3;
  auVar40._4_4_ = fVar14;
  auVar40._0_4_ = fVar14;
  auVar40._8_4_ = fVar14;
  auVar40._12_4_ = fVar14;
  uVar42 = auVar28._0_4_;
  auVar41._4_4_ = uVar42;
  auVar41._0_4_ = uVar42;
  auVar41._8_4_ = uVar42;
  auVar41._12_4_ = uVar42;
  auVar43._4_4_ = fVar15;
  auVar43._0_4_ = fVar15;
  auVar43._8_4_ = fVar15;
  auVar43._12_4_ = fVar15;
  auVar44 = vfmadd231ss_fma(auVar29,auVar38,ZEXT416(0x41100000));
  auVar27 = vfmadd213ss_avx512f(ZEXT416(0xc0400000),auVar38,auVar33);
  auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar38,ZEXT416(0x40800000));
  auVar28 = vfmadd213ss_fma(auVar32,auVar38,ZEXT416(0xbf800000));
  auVar27 = vbroadcastss_avx512vl(auVar27);
  auVar44._4_4_ = auVar44._0_4_;
  auVar44._8_4_ = auVar44._0_4_;
  auVar44._12_4_ = auVar44._0_4_;
  uVar42 = auVar19._0_4_;
  auVar38._4_4_ = uVar42;
  auVar38._0_4_ = uVar42;
  auVar38._8_4_ = uVar42;
  auVar38._12_4_ = uVar42;
  auVar28._4_4_ = auVar28._0_4_;
  auVar28._8_4_ = auVar28._0_4_;
  auVar28._12_4_ = auVar28._0_4_;
  uVar23 = 0;
  auVar19 = vpmovsxbd_avx(ZEXT416(0x3020100));
  for (; uVar23 < uVar5; uVar23 = uVar23 + 4) {
    uVar24 = (ulong)*(uint *)(*(long *)&(this->super_CurveGeometry).super_Geometry.field_0x58 +
                             *(long *)&(this->super_CurveGeometry).field_0x68 * (ulong)uVar4);
    uVar21 = (ulong)uVar23;
    auVar29 = vpbroadcastd_avx512vl();
    auVar29 = vpor_avx(auVar29,auVar19);
    uVar25 = vpcmpgtd_avx512vl(auVar26,auVar29);
    uVar25 = uVar25 & 0xf;
    piVar1 = (int *)(pcVar9 + uVar21 * 4 + uVar22 * uVar24);
    bVar10 = (byte)uVar25;
    auVar29._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * piVar1[1];
    auVar29._0_4_ = (uint)(bVar10 & 1) * *piVar1;
    auVar29._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * piVar1[2];
    auVar29._12_4_ = (uint)(byte)(uVar25 >> 3) * piVar1[3];
    piVar1 = (int *)(pcVar9 + uVar21 * 4 + (uVar24 + 1) * uVar22);
    auVar33._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * piVar1[1];
    auVar33._0_4_ = (uint)(bVar10 & 1) * *piVar1;
    auVar33._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * piVar1[2];
    auVar33._12_4_ = (uint)(byte)(uVar25 >> 3) * piVar1[3];
    piVar1 = (int *)(pcVar9 + uVar21 * 4 + (uVar24 + 2) * uVar22);
    auVar32._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * piVar1[1];
    auVar32._0_4_ = (uint)(bVar10 & 1) * *piVar1;
    auVar32._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * piVar1[2];
    auVar32._12_4_ = (uint)(byte)(uVar25 >> 3) * piVar1[3];
    piVar1 = (int *)(pcVar9 + uVar21 * 4 + (uVar24 + 3) * uVar22);
    auVar31._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * piVar1[1];
    auVar31._0_4_ = (uint)(bVar10 & 1) * *piVar1;
    auVar31._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * piVar1[2];
    auVar31._12_4_ = (uint)(byte)(uVar25 >> 3) * piVar1[3];
    if (pfVar6 != (float *)0x0) {
      auVar30 = vmulps_avx512vl(auVar37,auVar31);
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar36,auVar32);
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar35,auVar33);
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar34,auVar29);
      pfVar2 = pfVar6 + uVar21;
      bVar11 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar13 = SUB81(uVar25 >> 3,0);
      *pfVar2 = (float)((uint)(bVar10 & 1) * auVar30._0_4_ |
                       (uint)!(bool)(bVar10 & 1) * (int)*pfVar2);
      pfVar2[1] = (float)((uint)bVar11 * auVar30._4_4_ | (uint)!bVar11 * (int)pfVar2[1]);
      pfVar2[2] = (float)((uint)bVar12 * auVar30._8_4_ | (uint)!bVar12 * (int)pfVar2[2]);
      pfVar2[3] = (float)((uint)bVar13 * auVar30._12_4_ | (uint)!bVar13 * (int)pfVar2[3]);
    }
    if (pfVar7 != (float *)0x0) {
      auVar30 = vmulps_avx512vl(auVar43,auVar31);
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar41,auVar32);
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar40,auVar33);
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar39,auVar29);
      pfVar2 = pfVar7 + uVar21;
      bVar11 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar13 = SUB81(uVar25 >> 3,0);
      *pfVar2 = (float)((uint)(bVar10 & 1) * auVar30._0_4_ |
                       (uint)!(bool)(bVar10 & 1) * (int)*pfVar2);
      pfVar2[1] = (float)((uint)bVar11 * auVar30._4_4_ | (uint)!bVar11 * (int)pfVar2[1]);
      pfVar2[2] = (float)((uint)bVar12 * auVar30._8_4_ | (uint)!bVar12 * (int)pfVar2[2]);
      pfVar2[3] = (float)((uint)bVar13 * auVar30._12_4_ | (uint)!bVar13 * (int)pfVar2[3]);
    }
    if (pfVar8 != (float *)0x0) {
      auVar31 = vmulps_avx512vl(auVar28,auVar31);
      auVar32 = vfmadd213ps_avx512vl(auVar32,auVar38,auVar31);
      auVar33 = vfmadd213ps_avx512vl(auVar33,auVar44,auVar32);
      auVar29 = vfmadd213ps_fma(auVar29,auVar27,auVar33);
      pfVar2 = pfVar8 + uVar21;
      bVar11 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar13 = SUB81(uVar25 >> 3,0);
      *pfVar2 = (float)((uint)(bVar10 & 1) * auVar29._0_4_ |
                       (uint)!(bool)(bVar10 & 1) * (int)*pfVar2);
      pfVar2[1] = (float)((uint)bVar11 * auVar29._4_4_ | (uint)!bVar11 * (int)pfVar2[1]);
      pfVar2[2] = (float)((uint)bVar12 * auVar29._8_4_ | (uint)!bVar12 * (int)pfVar2[2]);
      pfVar2[3] = (float)((uint)bVar13 * auVar29._12_4_ | (uint)!bVar13 * (int)pfVar2[3]);
    }
  }
  return;
}

Assistant:

void interpolate_impl(const RTCInterpolateArguments* const args)
    {
      unsigned int primID = args->primID;
      float u = args->u;
      RTCBufferType bufferType = args->bufferType;
      unsigned int bufferSlot = args->bufferSlot;
      float* P = args->P;
      float* dPdu = args->dPdu;
      float* ddPdudu = args->ddPdudu;
      unsigned int valueCount = args->valueCount;
      
      /* calculate base pointer and stride */
      assert((bufferType == RTC_BUFFER_TYPE_VERTEX && bufferSlot < numTimeSteps) ||
             (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE && bufferSlot <= vertexAttribs.size()));
      const char* src = nullptr; 
      size_t stride = 0;
      if (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
        src    = vertexAttribs[bufferSlot].getPtr();
        stride = vertexAttribs[bufferSlot].getStride();
      } else {
        src    = vertices[bufferSlot].getPtr();
        stride = vertices[bufferSlot].getStride();
      }

      for (unsigned int i=0; i<valueCount; i+=N)
      {
        size_t ofs = i*sizeof(float);
        const size_t index = curves[primID];
        const vbool<N> valid = vint<N>((int)i)+vint<N>(step) < vint<N>((int)valueCount);
        const vfloat<N> p0 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+0)*stride+ofs]);
        const vfloat<N> p1 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+1)*stride+ofs]);
        const vfloat<N> p2 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+2)*stride+ofs]);
        const vfloat<N> p3 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+3)*stride+ofs]);
        
        const Curve<vfloat<N>> curve(p0,p1,p2,p3);
        if (P      ) mem<vfloat<N>>::storeu(valid,P+i,      curve.eval(u));
        if (dPdu   ) mem<vfloat<N>>::storeu(valid,dPdu+i,   curve.eval_du(u));
        if (ddPdudu) mem<vfloat<N>>::storeu(valid,ddPdudu+i,curve.eval_dudu(u));
      }
    }